

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

bool __thiscall filesystem::path::is_file(path *this)

{
  int iVar1;
  string local_c8;
  stat sb;
  
  str_abi_cxx11_(&local_c8,this,native_path);
  iVar1 = stat(local_c8._M_dataplus._M_p,(stat *)&sb);
  std::__cxx11::string::~string((string *)&local_c8);
  return (sb.st_mode & 0xf000) == 0x8000 && iVar1 == 0;
}

Assistant:

bool is_file() const {
#if defined(_WIN32)
        DWORD attr = GetFileAttributesW(wstr().c_str());
        return (attr != INVALID_FILE_ATTRIBUTES && (attr & FILE_ATTRIBUTE_DIRECTORY) == 0);
#else
        struct stat sb;
        if (stat(str().c_str(), &sb))
            return false;
        return S_ISREG(sb.st_mode);
#endif
    }